

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O2

void outdefines(Global *global)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ushort **ppuVar4;
  byte *pbVar5;
  undefined8 *puVar6;
  int number;
  uint c;
  char local_58 [40];
  
  deldefines(global);
  uVar3 = 0x958;
  do {
    if (0xb57 < uVar3) {
      return;
    }
    for (puVar6 = *(undefined8 **)(global->work + (uVar3 - 0x40)); puVar6 != (undefined8 *)0x0;
        puVar6 = (undefined8 *)*puVar6) {
      Putstring(global,"#define ");
      Putstring(global,(char *)((long)puVar6 + 0x1c));
      if (*(int *)(puVar6 + 3) < 1) {
        if (*(int *)(puVar6 + 3) == 0) {
          Putstring(global,"()");
        }
      }
      else {
        Putchar(global,0x28);
        number = 1;
        while( true ) {
          iVar2 = *(int *)(puVar6 + 3);
          Putstring(global,"__");
          Putint(global,number);
          if (iVar2 <= number) break;
          Putchar(global,0x2c);
          number = number + 1;
        }
        Putchar(global,0x29);
      }
      if (puVar6[1] != 0) {
        Putchar(global,9);
        pbVar5 = (byte *)puVar6[1];
switchD_001064ab_caseD_1d:
        bVar1 = *pbVar5;
        if (bVar1 != 0) {
          pbVar5 = pbVar5 + 1;
          c = (uint)bVar1;
          if ((byte)(bVar1 + 0x81) < 0x20) {
            Putstring(global,"__");
            Putint(global,c - 0x7e);
          }
          else {
            ppuVar4 = __ctype_b_loc();
            if (((byte)(bVar1 - 9) < 2) || (((*ppuVar4)[bVar1] & 0x4000) != 0)) {
              Putchar(global,c);
            }
            else {
              switch(bVar1) {
              case 0x1c:
                Putchar(global,0x23);
                break;
              case 0x1d:
                break;
              case 0x1e:
                Putstring(global,"##");
                break;
              case 0x1f:
                Putchar(global,0x20);
                break;
              default:
                if (c != 0x9f) {
                  sprintf(local_58,"\\0%o",(ulong)c);
                  Putstring(global,local_58);
                }
              }
            }
          }
          goto switchD_001064ab_caseD_1d;
        }
      }
      Putchar(global,10);
    }
    uVar3 = uVar3 + 8;
  } while( true );
}

Assistant:

void outdefines(struct Global *global)
{
  DEFBUF *dp;
  DEFBUF **syp;
  
  deldefines(global);                   /* Delete built-in #defines     */
  for (syp = global->symtab; syp < &global->symtab[SBSIZE]; syp++) {
    if ((dp = *syp) != (DEFBUF *) NULL) {
      do {
	outadefine(global, dp);
      } while ((dp = dp->link) != (DEFBUF *) NULL);
    }
  }
}